

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

int mbedtls_ssl_set_session(mbedtls_ssl_context *ssl,mbedtls_ssl_session *session)

{
  int iVar1;
  
  iVar1 = -0x7100;
  if ((((session != (mbedtls_ssl_session *)0x0 && ssl != (mbedtls_ssl_context *)0x0) &&
       (ssl->session_negotiate != (mbedtls_ssl_session *)0x0)) &&
      ((ssl->conf->field_0x164 & 1) == 0)) &&
     (iVar1 = ssl_session_copy(ssl->session_negotiate,session), iVar1 == 0)) {
    ssl->handshake->resume = 1;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int mbedtls_ssl_set_session( mbedtls_ssl_context *ssl, const mbedtls_ssl_session *session )
{
    int ret;

    if( ssl == NULL ||
        session == NULL ||
        ssl->session_negotiate == NULL ||
        ssl->conf->endpoint != MBEDTLS_SSL_IS_CLIENT )
    {
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );
    }

    if( ( ret = ssl_session_copy( ssl->session_negotiate, session ) ) != 0 )
        return( ret );

    ssl->handshake->resume = 1;

    return( 0 );
}